

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void __thiscall
NTrodeObj::serialize<cereal::PortableBinaryOutputArchive>
          (NTrodeObj *this,PortableBinaryOutputArchive *archive)

{
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *unaff_retaddr;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe8;
  
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, index, hw_chans);
    }